

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

int Fra_FraigMiterAssertedOutput(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  int i;
  
  i = 0;
  do {
    if (p->nObjs[3] - p->nRegs <= i) {
      return -1;
    }
    pvVar2 = Vec_PtrEntry(p->vCos,i);
    pAVar1 = *(Aig_Obj_t **)((long)pvVar2 + 8);
    if (pAVar1 != (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
      if (pAVar1 == p->pConst1) {
        return i;
      }
      if ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
        return i;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Fra_FraigMiterAssertedOutput( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            continue;
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
            return i;
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
            return i;
    }
    return -1;
}